

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_enum_util_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::ValidateEnumTest_GenerateEnumDataBitmapWithOverflow_Test
::~ValidateEnumTest_GenerateEnumDataBitmapWithOverflow_Test
          (ValidateEnumTest_GenerateEnumDataBitmapWithOverflow_Test *this)

{
  ValidateEnumTest_GenerateEnumDataBitmapWithOverflow_Test *this_local;
  
  ~ValidateEnumTest_GenerateEnumDataBitmapWithOverflow_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ValidateEnumTest, GenerateEnumDataBitmapWithOverflow) {
  std::vector<int32_t> values;
  // We step by 10 to guarantee each new value is more cost effective to add to
  // the bitmap, which would cause an overflow of the 16-bit bitmap size if we
  // didn't prevent it in the generator.
  for (int32_t i = -33000; i < 33000; i += 10) {
    values.push_back(i);
  }
  const auto data = GenerateEnumData(values);

  EXPECT_THAT(ExtractHeader(data),
              HeaderHas(_, _,
                        // we reached the maximum size for the bitmap.
                        0x10000 - 32,
                        // we have some in the fallback
                        Gt(0)));

  TestRoundTrip(values, __LINE__);
}